

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

void cmd_ln_val_free(cmd_ln_val_t *val)

{
  void *ptr;
  char **array;
  int i;
  cmd_ln_val_t *val_local;
  
  if (((val->type & 0x20U) != 0) && (ptr = (val->val).ptr, ptr != (void *)0x0)) {
    array._4_4_ = 0;
    while (*(long *)((long)ptr + (long)array._4_4_ * 8) != 0) {
      ckd_free(*(void **)((long)ptr + (long)array._4_4_ * 8));
      array._4_4_ = array._4_4_ + 1;
    }
    ckd_free(ptr);
  }
  if ((val->type & 8U) != 0) {
    ckd_free((val->val).ptr);
  }
  ckd_free(val->name);
  ckd_free(val);
  return;
}

Assistant:

void
cmd_ln_val_free(cmd_ln_val_t *val)
{
    int i;
    if (val->type & ARG_STRING_LIST) {
        char ** array = (char **)val->val.ptr;
        if (array) {
            for (i = 0; array[i] != NULL; i++) {
                ckd_free(array[i]);
            }
            ckd_free(array);
        }
    }
    if (val->type & ARG_STRING)
        ckd_free(val->val.ptr);
    ckd_free(val->name);
    ckd_free(val);
}